

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O1

ExpressionValue *
expFuncReadAscii(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  Identifier *pIVar1;
  bool bVar2;
  char cVar3;
  uintmax_t uVar4;
  Identifier *args;
  long lVar5;
  long lVar6;
  int64_t start;
  int64_t length;
  string result;
  size_t bytesToRead;
  StringLiteral *fileName;
  path fullName;
  error_code error;
  ifstream file;
  char buffer [1024];
  int64_t local_700;
  Identifier *local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6f0;
  Identifier *local_6e8;
  undefined1 *local_6e0;
  long local_6d8;
  undefined1 local_6d0;
  undefined7 uStack_6cf;
  StringLiteral local_6c0;
  Identifier *local_6a0;
  Identifier *local_698;
  string local_690;
  path local_670;
  error_code local_650;
  undefined1 local_640 [32];
  byte abStack_620 [224];
  undefined8 local_540 [33];
  path local_438 [32];
  
  bVar2 = getExpFuncParameter(parameters,0,(StringLiteral **)&local_698,funcName,false);
  if (!bVar2) {
LAB_0012e754:
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    (__return_storage_ptr__->strValue)._value._M_string_length = 0;
    (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->field_1).intValue = 0;
    return __return_storage_ptr__;
  }
  local_700 = 0;
  bVar2 = getExpFuncParameter(parameters,1,&local_700,funcName,true);
  if (!bVar2) goto LAB_0012e754;
  local_6f8 = (Identifier *)0x0;
  bVar2 = getExpFuncParameter(parameters,2,(int64_t *)&local_6f8,funcName,true);
  if (!bVar2) goto LAB_0012e754;
  StringLiteral::path(local_438,(StringLiteral *)local_698);
  getFullPathName(&local_670,local_438);
  ghc::filesystem::path::~path(local_438);
  local_650._M_value = 0;
  local_650._M_cat = (error_category *)std::_V2::system_category();
  uVar4 = ghc::filesystem::file_size(&local_670,&local_650);
  args = local_6f8;
  if ((local_6f8 == (Identifier *)0x0) ||
     (args = (Identifier *)((long)&(local_6f8->_name)._M_dataplus._M_p + local_700),
     (long)uVar4 < (long)args)) {
    local_6f8 = (Identifier *)(uVar4 - local_700);
  }
  ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
            ((basic_ifstream<char,_std::char_traits<char>_> *)local_640,&local_670,_S_in|_S_bin);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    Logger::queueError<StringLiteral>
              ((Logger *)0x1,0x1895cd,(char *)local_698,(StringLiteral *)args);
  }
  else {
    std::istream::seekg(local_640,local_700,0);
    pIVar1 = local_6f8;
    if ((abStack_620[(long)*(_func_int **)(local_640._0_8_ + -0x18)] & 7) == 0) {
      local_6a0 = local_698;
      local_6e0 = &local_6d0;
      local_6d8 = 0;
      local_6d0 = 0;
      if (0 < (long)local_6f8) {
        local_6f0 = &(__return_storage_ptr__->strValue)._value.field_2;
        lVar5 = 0;
        local_6e8 = (Identifier *)0x0;
        do {
          local_6c0._value._M_dataplus._M_p = (pointer)((long)pIVar1 - lVar5);
          if (0x3ff < (long)local_6c0._value._M_dataplus._M_p) {
            local_6c0._value._M_dataplus._M_p = (pointer)0x400;
          }
          std::istream::read(local_640,(long)local_438);
          if ((abStack_620[(long)*(_func_int **)(local_640._0_8_ + -0x18)] & 5) == 0) {
            if (0 < (long)local_640._8_8_) {
              lVar6 = 0;
              do {
                cVar3 = *(char *)((long)&local_438[0]._path._M_dataplus._M_p + lVar6);
                if (cVar3 == '\0') {
                  bVar2 = true;
                  args = (Identifier *)CONCAT71((int7)((ulong)args >> 8),1);
                  local_6e8 = args;
                  goto LAB_0012e91c;
                }
                if (cVar3 < ' ') {
                  Logger::printError<Identifier>((Logger *)0x0,0x18962e,(char *)funcName,args);
                  goto LAB_0012e8ba;
                }
                std::__cxx11::string::push_back((char)&local_6e0);
                lVar6 = lVar6 + 1;
              } while (lVar6 < (long)local_640._8_8_);
            }
            bVar2 = true;
          }
          else {
            args = local_6a0;
            Logger::queueError<unsigned_long,StringLiteral>
                      (Error,"Failed to read %d byte(s) from offset 0x%08X of %s",
                       (unsigned_long *)&local_6c0,(StringLiteral *)local_6a0);
LAB_0012e8ba:
            (__return_storage_ptr__->strValue)._value._M_dataplus._M_p = (pointer)local_6f0;
            bVar2 = false;
            (__return_storage_ptr__->strValue)._value._M_string_length = 0;
            (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
            __return_storage_ptr__->type = Invalid;
            (__return_storage_ptr__->field_1).intValue = 0;
          }
LAB_0012e91c:
          if (!bVar2) goto LAB_0012e9e6;
        } while ((((ulong)local_6e8 & 1) == 0) && (lVar5 = lVar5 + 0x400, lVar5 < (long)pIVar1));
      }
      local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_690,local_6e0,local_6e0 + local_6d8);
      StringLiteral::StringLiteral(&local_6c0,&local_690);
      __return_storage_ptr__->type = String;
      (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->strValue,local_6c0._value._M_dataplus._M_p,
                 local_6c0._value._M_dataplus._M_p + local_6c0._value._M_string_length);
      (__return_storage_ptr__->field_1).intValue = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._value._M_dataplus._M_p != &local_6c0._value.field_2) {
        operator_delete(local_6c0._value._M_dataplus._M_p,
                        local_6c0._value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_690._M_dataplus._M_p != &local_690.field_2) {
        operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
      }
LAB_0012e9e6:
      if (local_6e0 != &local_6d0) {
        operator_delete(local_6e0,CONCAT71(uStack_6cf,local_6d0) + 1);
      }
      goto LAB_0012e7b5;
    }
    Logger::queueError<long,StringLiteral>
              (Error,"Invalid offset 0x%08X of %s",&local_700,(StringLiteral *)local_698);
  }
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
LAB_0012e7b5:
  local_640._0_8_ =
       std::ifstream-in-ghc::filesystem::basic_ifstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_540[0] = 0x1be630;
  std::filebuf::~filebuf((filebuf *)(local_640 + 0x10));
  local_640._0_8_ =
       std::istream-in-ghc::filesystem::basic_ifstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_540[0] = 0x1be680;
  local_640._8_8_ = 0;
  std::ios_base::~ios_base((ios_base *)local_540);
  ghc::filesystem::path::~path(&local_670);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncReadAscii(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	const StringLiteral* fileName;
	int64_t start;
	int64_t length;

	GET_PARAM(parameters,0,fileName);
	GET_OPTIONAL_PARAM(parameters,1,start,0);
	GET_OPTIONAL_PARAM(parameters,2,length,0);

	auto fullName = getFullPathName(fileName->path());

	std::error_code error;
	int64_t totalSize = static_cast<int64_t>(fs::file_size(fullName, error));

	if (length == 0 || start+length > totalSize)
		length = totalSize-start;

	fs::ifstream file(fullName, fs::ifstream::in | fs::ifstream::binary);
	if (!file.is_open())
	{
		Logger::queueError(Logger::Error, "Could not open %s", *fileName);
		return ExpressionValue();
	}

	file.seekg(start);
	if (file.eof() || file.fail())
	{
		Logger::queueError(Logger::Error, "Invalid offset 0x%08X of %s", start, *fileName);
		return ExpressionValue();
	}

	char buffer[1024];
	bool stringTerminated = false;
	std::string result;

	for (int64_t progress = 0; !stringTerminated && progress < length; progress += (int64_t) sizeof(buffer))
	{
		auto bytesToRead = (size_t) std::min((int64_t) sizeof(buffer), length - progress);

		file.read(buffer, bytesToRead);
		if (file.fail())
		{
			Logger::queueError(Logger::Error, "Failed to read %d byte(s) from offset 0x%08X of %s", bytesToRead, *fileName);
			return ExpressionValue();
		}

		for (std::streamsize i = 0; i < file.gcount(); i++)
		{
			if (buffer[i] == 0x00)
			{
				stringTerminated = true;
				break;
			}

			if (buffer[i] < 0x20)
			{
				Logger::printError(Logger::Warning, "%s: Non-ASCII character", funcName);
				return ExpressionValue();
			}

			result += buffer[i];
		}
	}

	return ExpressionValue(result);
}